

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::PostprocessHelper_SplitFacesByTextureID
          (AMFImporter *this,
          list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
          *pInputList,
          list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
          *pOutputList_Separated)

{
  CAMFImporter_NodeElement_Color *pTexMap1;
  bool bVar1;
  reference pvVar2;
  pointer pSVar3;
  reference __x;
  const_iterator local_90;
  _List_iterator<Assimp::AMFImporter::SComplexFace> local_88;
  iterator it_old;
  _Self local_70;
  iterator it_end;
  iterator it;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  face_list_cur;
  SComplexFace face_start;
  anon_class_1_0_00000001 texmap_is_equal;
  list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  *pOutputList_Separated_local;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  *pInputList_local;
  AMFImporter *this_local;
  
  std::__cxx11::
  list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  ::clear(pOutputList_Separated);
  bVar1 = std::__cxx11::
          list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
          ::empty(pInputList);
  if (!bVar1) {
    do {
      pvVar2 = std::__cxx11::
               list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
               ::front(pInputList);
      SComplexFace::SComplexFace
                ((SComplexFace *)
                 &face_list_cur.
                  super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                  ._M_impl._M_node._M_size,pvVar2);
      std::__cxx11::
      list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>::
      list((list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
            *)&it);
      it_end = std::__cxx11::
               list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
               ::begin(pInputList);
      local_70._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
           ::end(pInputList);
      while (bVar1 = std::operator!=(&it_end,&local_70), pTexMap1 = face_start.Color, bVar1) {
        pSVar3 = std::_List_iterator<Assimp::AMFImporter::SComplexFace>::operator->(&it_end);
        bVar1 = PostprocessHelper_SplitFacesByTextureID::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&face_start.TexMap + 7),
                           (CAMFImporter_NodeElement_TexMap *)pTexMap1,pSVar3->TexMap);
        if (bVar1) {
          local_88._M_node = it_end._M_node;
          std::_List_iterator<Assimp::AMFImporter::SComplexFace>::operator++(&it_end);
          __x = std::_List_iterator<Assimp::AMFImporter::SComplexFace>::operator*(&local_88);
          std::__cxx11::
          list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
          ::push_back((list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                       *)&it,__x);
          std::_List_const_iterator<Assimp::AMFImporter::SComplexFace>::_List_const_iterator
                    (&local_90,&local_88);
          std::__cxx11::
          list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
          ::erase(pInputList,local_90);
        }
        else {
          std::_List_iterator<Assimp::AMFImporter::SComplexFace>::operator++(&it_end);
        }
      }
      bVar1 = std::__cxx11::
              list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
              ::empty((list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                       *)&it);
      if (!bVar1) {
        std::__cxx11::
        list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
        ::push_back(pOutputList_Separated,(value_type *)&it);
      }
      std::__cxx11::
      list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>::
      ~list((list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
             *)&it);
      SComplexFace::~SComplexFace
                ((SComplexFace *)
                 &face_list_cur.
                  super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                  ._M_impl._M_node._M_size);
      bVar1 = std::__cxx11::
              list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
              ::empty(pInputList);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  return;
}

Assistant:

void AMFImporter::PostprocessHelper_SplitFacesByTextureID(std::list<SComplexFace>& pInputList, std::list<std::list<SComplexFace> >& pOutputList_Separated)
{
    auto texmap_is_equal = [](const CAMFImporter_NodeElement_TexMap* pTexMap1, const CAMFImporter_NodeElement_TexMap* pTexMap2) -> bool
    {
	    if((pTexMap1 == nullptr) && (pTexMap2 == nullptr)) return true;
	    if(pTexMap1 == nullptr) return false;
	    if(pTexMap2 == nullptr) return false;

	    if(pTexMap1->TextureID_R != pTexMap2->TextureID_R) return false;
	    if(pTexMap1->TextureID_G != pTexMap2->TextureID_G) return false;
	    if(pTexMap1->TextureID_B != pTexMap2->TextureID_B) return false;
	    if(pTexMap1->TextureID_A != pTexMap2->TextureID_A) return false;

	    return true;
    };

	pOutputList_Separated.clear();
	if(pInputList.empty()) return;

	do
	{
		SComplexFace face_start = pInputList.front();
		std::list<SComplexFace> face_list_cur;

		for(std::list<SComplexFace>::iterator it = pInputList.begin(), it_end = pInputList.end(); it != it_end;)
		{
			if(texmap_is_equal(face_start.TexMap, it->TexMap))
			{
				auto it_old = it;

				++it;
				face_list_cur.push_back(*it_old);
				pInputList.erase(it_old);
			}
			else
			{
				++it;
			}
		}

		if(!face_list_cur.empty()) pOutputList_Separated.push_back(face_list_cur);

	} while(!pInputList.empty());
}